

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

int MPLSParser::calcPlayItemID(MPLSStreamInfo *streamInfo,uint32_t pts)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  pointer ppVar5;
  int local_3c;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_> local_30;
  ulong local_28;
  size_t i;
  MPLSStreamInfo *pMStack_18;
  uint32_t pts_local;
  MPLSStreamInfo *streamInfo_local;
  
  local_28 = 0;
  i._4_4_ = pts;
  pMStack_18 = streamInfo;
  do {
    uVar1 = local_28;
    sVar3 = std::
            vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
            ::size(&(pMStack_18->super_M2TSStreamInfo).m_index);
    if (sVar3 <= uVar1) {
      sVar3 = std::
              vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
              ::size(&(pMStack_18->super_M2TSStreamInfo).m_index);
      local_3c = (int)sVar3;
LAB_00366c59:
      streamInfo_local._4_4_ = local_3c + -1;
      return streamInfo_local._4_4_;
    }
    pvVar4 = std::
             vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             ::operator[](&(pMStack_18->super_M2TSStreamInfo).m_index,local_28);
    bVar2 = std::
            map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
            ::empty(pvVar4);
    if (!bVar2) {
      pvVar4 = std::
               vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
               ::operator[](&(pMStack_18->super_M2TSStreamInfo).m_index,local_28);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
           ::begin(pvVar4);
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>::
               operator->(&local_30);
      if ((ulong)i._4_4_ < ppVar5->first) {
        local_3c = (int)local_28;
        if (local_3c < 2) {
          local_3c = 1;
        }
        goto LAB_00366c59;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int MPLSParser::calcPlayItemID(const MPLSStreamInfo& streamInfo, const uint32_t pts)
{
    for (size_t i = 0; i < streamInfo.m_index.size(); i++)
    {
        if (!streamInfo.m_index[i].empty())
        {
            if (streamInfo.m_index[i].begin()->first > pts)
                return FFMAX((int)i, 1) - 1;
        }
    }
    return static_cast<int>(streamInfo.m_index.size()) - 1;
}